

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_bbdpre.c
# Opt level: O0

int KINBBDPrecInit(void *kinmem,sunindextype Nlocal,sunindextype mudq,sunindextype mldq,
                  sunindextype mukeep,sunindextype mlkeep,realtype dq_rel_uu,KINBBDLocalFn gloc,
                  KINBBDCommFn gcomm)

{
  int iVar1;
  SUNMatrix p_Var2;
  N_Vector p_Var3;
  SUNLinearSolver p_Var4;
  KINMem local_138;
  KINMem local_130;
  sunindextype local_128;
  realtype local_120;
  realtype local_118;
  realtype local_110;
  long local_100;
  long local_f8;
  long local_f0;
  long local_e0;
  long local_d8;
  long local_d0;
  long local_c0;
  long local_b8;
  long local_b0;
  long lStack_98;
  int flag;
  long liw;
  long lrw;
  sunindextype liw1;
  sunindextype lrw1;
  sunindextype storage_mu;
  sunindextype mlk;
  sunindextype muk;
  KBBDPrecData pdata;
  KINLsMem kinls_mem;
  KINMem kin_mem;
  realtype dq_rel_uu_local;
  sunindextype mlkeep_local;
  sunindextype mukeep_local;
  sunindextype mldq_local;
  sunindextype mudq_local;
  sunindextype Nlocal_local;
  void *kinmem_local;
  
  kin_mem = (KINMem)dq_rel_uu;
  dq_rel_uu_local = (realtype)mlkeep;
  mlkeep_local = mukeep;
  mukeep_local = mldq;
  mldq_local = mudq;
  mudq_local = Nlocal;
  Nlocal_local = (sunindextype)kinmem;
  if (kinmem == (void *)0x0) {
    KINProcessError((KINMem)0x0,-1,"KINBBDPRE","KINBBDPrecInit","KINSOL Memory is NULL.");
    kinmem_local._4_4_ = -1;
  }
  else {
    kinls_mem = (KINLsMem)kinmem;
    if (*(long *)((long)kinmem + 0x1f8) == 0) {
      KINProcessError((KINMem)kinmem,-2,"KINBBDPRE","KINBBDPrecInit",
                      "Linear solver memory is NULL. One of the SPILS linear solvers must be attached."
                     );
      kinmem_local._4_4_ = -2;
    }
    else {
      pdata = *(KBBDPrecData *)((long)kinmem + 0x1f8);
      if (*(long *)(*(long *)(*(long *)((long)kinmem + 0x140) + 8) + 0x28) == 0) {
        KINProcessError((KINMem)kinmem,-3,"KINBBDPRE","KINBBDPrecInit",
                        "A required vector operation is not implemented.");
        kinmem_local._4_4_ = -3;
      }
      else {
        muk = 0;
        muk = (sunindextype)malloc(0x98);
        if ((long *)muk == (long *)0x0) {
          KINProcessError((KINMem)kinls_mem,-4,"KINBBDPRE","KINBBDPrecInit",
                          "A memory request failed.");
          kinmem_local._4_4_ = -4;
        }
        else {
          *(sunindextype *)(muk + 0x90) = Nlocal_local;
          *(KINBBDLocalFn *)(muk + 0x28) = gloc;
          *(KINBBDCommFn *)(muk + 0x30) = gcomm;
          if (mldq_local < 0) {
            local_b0 = 0;
          }
          else {
            local_b0 = mldq_local;
          }
          if (mudq_local + -1 < local_b0) {
            local_b8 = mudq_local + -1;
          }
          else {
            if (mldq_local < 0) {
              local_c0 = 0;
            }
            else {
              local_c0 = mldq_local;
            }
            local_b8 = local_c0;
          }
          *(long *)muk = local_b8;
          if (mukeep_local < 0) {
            local_d0 = 0;
          }
          else {
            local_d0 = mukeep_local;
          }
          if (mudq_local + -1 < local_d0) {
            local_d8 = mudq_local + -1;
          }
          else {
            if (mukeep_local < 0) {
              local_e0 = 0;
            }
            else {
              local_e0 = mukeep_local;
            }
            local_d8 = local_e0;
          }
          *(long *)(muk + 8) = local_d8;
          if (mlkeep_local < 0) {
            local_f0 = 0;
          }
          else {
            local_f0 = mlkeep_local;
          }
          if (mudq_local + -1 < local_f0) {
            local_f8 = mudq_local + -1;
          }
          else {
            if (mlkeep_local < 0) {
              local_100 = 0;
            }
            else {
              local_100 = mlkeep_local;
            }
            local_f8 = local_100;
          }
          mlk = local_f8;
          if ((long)dq_rel_uu_local < 0) {
            local_110 = 0.0;
          }
          else {
            local_110 = dq_rel_uu_local;
          }
          if (mudq_local + -1 < (long)local_110) {
            local_118 = (realtype)(mudq_local + -1);
          }
          else {
            if ((long)dq_rel_uu_local < 0) {
              local_120 = 0.0;
            }
            else {
              local_120 = dq_rel_uu_local;
            }
            local_118 = local_120;
          }
          storage_mu = (sunindextype)local_118;
          *(long *)(muk + 0x10) = local_f8;
          *(realtype *)(muk + 0x18) = local_118;
          if (mudq_local + -1 < local_f8 + (long)local_118) {
            local_128 = mudq_local + -1;
          }
          else {
            local_128 = local_f8 + (long)local_118;
          }
          lrw1 = local_128;
          *(long *)(muk + 0x40) = 0;
          p_Var2 = SUNBandMatrixStorage(mudq_local,local_f8,(sunindextype)local_118,local_128);
          *(SUNMatrix *)(muk + 0x40) = p_Var2;
          if (*(long *)(muk + 0x40) == 0) {
            free((void *)muk);
            muk = 0;
            KINProcessError((KINMem)kinls_mem,-4,"KINBBDPRE","KINBBDPrecInit",
                            "A memory request failed.");
            kinmem_local._4_4_ = -4;
          }
          else {
            *(undefined8 *)(muk + 0x58) = 0;
            p_Var3 = N_VNew_Serial(mudq_local);
            *(N_Vector *)(muk + 0x58) = p_Var3;
            if (*(long *)(muk + 0x58) == 0) {
              SUNMatDestroy(*(SUNMatrix *)(muk + 0x40));
              free((void *)muk);
              muk = 0;
              KINProcessError((KINMem)kinls_mem,-4,"KINBBDPRE","KINBBDPrecInit",
                              "A memory request failed.");
              kinmem_local._4_4_ = -4;
            }
            else {
              *(undefined8 *)(muk + 0x50) = 0;
              p_Var3 = N_VNewEmpty_Serial(mudq_local);
              *(N_Vector *)(muk + 0x50) = p_Var3;
              if (*(long *)(muk + 0x50) == 0) {
                N_VDestroy(*(N_Vector *)(muk + 0x58));
                SUNMatDestroy(*(SUNMatrix *)(muk + 0x40));
                free((void *)muk);
                muk = 0;
                KINProcessError((KINMem)kinls_mem,-4,"KINBBDPRE","KINBBDPrecInit",
                                "A memory request failed.");
                kinmem_local._4_4_ = -4;
              }
              else {
                *(undefined8 *)(muk + 0x60) = 0;
                p_Var3 = N_VClone((N_Vector)kinls_mem[1].pdata);
                *(N_Vector *)(muk + 0x60) = p_Var3;
                if (*(long *)(muk + 0x60) == 0) {
                  N_VDestroy(*(N_Vector *)(muk + 0x58));
                  N_VDestroy(*(N_Vector *)(muk + 0x50));
                  SUNMatDestroy(*(SUNMatrix *)(muk + 0x40));
                  free((void *)muk);
                  muk = 0;
                  KINProcessError((KINMem)kinls_mem,-4,"KINBBDPRE","KINBBDPrecInit",
                                  "A memory request failed.");
                  kinmem_local._4_4_ = -4;
                }
                else {
                  *(undefined8 *)(muk + 0x68) = 0;
                  p_Var3 = N_VClone((N_Vector)kinls_mem[1].pdata);
                  *(N_Vector *)(muk + 0x68) = p_Var3;
                  if (*(long *)(muk + 0x68) == 0) {
                    N_VDestroy(*(N_Vector *)(muk + 0x58));
                    N_VDestroy(*(N_Vector *)(muk + 0x50));
                    N_VDestroy(*(N_Vector *)(muk + 0x60));
                    SUNMatDestroy(*(SUNMatrix *)(muk + 0x40));
                    free((void *)muk);
                    muk = 0;
                    KINProcessError((KINMem)kinls_mem,-4,"KINBBDPRE","KINBBDPrecInit",
                                    "A memory request failed.");
                    kinmem_local._4_4_ = -4;
                  }
                  else {
                    *(undefined8 *)(muk + 0x70) = 0;
                    p_Var3 = N_VClone((N_Vector)kinls_mem[1].pdata);
                    *(N_Vector *)(muk + 0x70) = p_Var3;
                    if (*(long *)(muk + 0x70) == 0) {
                      N_VDestroy(*(N_Vector *)(muk + 0x58));
                      N_VDestroy(*(N_Vector *)(muk + 0x50));
                      N_VDestroy(*(N_Vector *)(muk + 0x60));
                      N_VDestroy(*(N_Vector *)(muk + 0x68));
                      SUNMatDestroy(*(SUNMatrix *)(muk + 0x40));
                      free((void *)muk);
                      muk = 0;
                      KINProcessError((KINMem)kinls_mem,-4,"KINBBDPRE","KINBBDPrecInit",
                                      "A memory request failed.");
                      kinmem_local._4_4_ = -4;
                    }
                    else {
                      *(undefined8 *)(muk + 0x48) = 0;
                      p_Var4 = SUNLinSol_Band(*(N_Vector *)(muk + 0x58),*(SUNMatrix *)(muk + 0x40));
                      *(SUNLinearSolver *)(muk + 0x48) = p_Var4;
                      if (*(long *)(muk + 0x48) == 0) {
                        N_VDestroy(*(N_Vector *)(muk + 0x58));
                        N_VDestroy(*(N_Vector *)(muk + 0x50));
                        N_VDestroy(*(N_Vector *)(muk + 0x60));
                        N_VDestroy(*(N_Vector *)(muk + 0x68));
                        N_VDestroy(*(N_Vector *)(muk + 0x70));
                        SUNMatDestroy(*(SUNMatrix *)(muk + 0x40));
                        free((void *)muk);
                        muk = 0;
                        KINProcessError((KINMem)kinls_mem,-4,"KINBBDPRE","KINBBDPrecInit",
                                        "A memory request failed.");
                        kinmem_local._4_4_ = -4;
                      }
                      else {
                        iVar1 = SUNLinSolInitialize(*(SUNLinearSolver *)(muk + 0x48));
                        if (iVar1 == 0) {
                          if ((double)kin_mem <= 0.0) {
                            if (0.0 < *(double *)kinls_mem) {
                              local_138 = (KINMem)sqrt(*(double *)kinls_mem);
                            }
                            else {
                              local_138 = (KINMem)0x0;
                            }
                            local_130 = local_138;
                          }
                          else {
                            local_130 = kin_mem;
                          }
                          *(KINMem *)(muk + 0x20) = local_130;
                          *(sunindextype *)(muk + 0x38) = mudq_local;
                          *(undefined8 *)(muk + 0x78) = 0;
                          *(undefined8 *)(muk + 0x80) = 0;
                          if (*(long *)(*(long *)((long)kinls_mem[1].pdata + 8) + 0x20) != 0) {
                            N_VSpace((N_Vector)kinls_mem[1].pdata,&liw1,&lrw);
                            *(sunindextype *)(muk + 0x78) = liw1 * 3 + *(long *)(muk + 0x78);
                            *(long *)(muk + 0x80) = lrw * 3 + *(long *)(muk + 0x80);
                          }
                          if (*(long *)(*(long *)(*(long *)(muk + 0x58) + 8) + 0x20) != 0) {
                            N_VSpace(*(N_Vector *)(muk + 0x58),&liw1,&lrw);
                            *(sunindextype *)(muk + 0x78) = liw1 + *(long *)(muk + 0x78);
                            *(long *)(muk + 0x80) = lrw + *(long *)(muk + 0x80);
                          }
                          if (*(long *)(*(long *)(*(long *)(muk + 0x50) + 8) + 0x20) != 0) {
                            N_VSpace(*(N_Vector *)(muk + 0x50),&liw1,&lrw);
                            *(sunindextype *)(muk + 0x78) = liw1 + *(long *)(muk + 0x78);
                            *(long *)(muk + 0x80) = lrw + *(long *)(muk + 0x80);
                          }
                          if (*(long *)(*(long *)(*(long *)(muk + 0x40) + 8) + 0x40) != 0) {
                            SUNMatSpace(*(SUNMatrix *)(muk + 0x40),&liw,&stack0xffffffffffffff68);
                            *(long *)(muk + 0x78) = liw + *(long *)(muk + 0x78);
                            *(long *)(muk + 0x80) = lStack_98 + *(long *)(muk + 0x80);
                          }
                          if (*(long *)(*(long *)(*(long *)(muk + 0x48) + 8) + 0x50) != 0) {
                            SUNLinSolSpace(*(SUNLinearSolver *)(muk + 0x48),&liw,
                                           &stack0xffffffffffffff68);
                            *(long *)(muk + 0x78) = liw + *(long *)(muk + 0x78);
                            *(long *)(muk + 0x80) = lStack_98 + *(long *)(muk + 0x80);
                          }
                          *(undefined8 *)(muk + 0x88) = 0;
                          if (pdata->nge != 0) {
                            (*(code *)pdata->nge)(kinls_mem);
                          }
                          pdata->kin_mem = (void *)muk;
                          pdata->nge = (long)KINBBDPrecFree;
                          kinmem_local._4_4_ =
                               KINSetPreconditioner
                                         ((void *)Nlocal_local,KINBBDPrecSetup,KINBBDPrecSolve);
                        }
                        else {
                          N_VDestroy(*(N_Vector *)(muk + 0x58));
                          N_VDestroy(*(N_Vector *)(muk + 0x50));
                          N_VDestroy(*(N_Vector *)(muk + 0x60));
                          N_VDestroy(*(N_Vector *)(muk + 0x68));
                          N_VDestroy(*(N_Vector *)(muk + 0x70));
                          SUNMatDestroy(*(SUNMatrix *)(muk + 0x40));
                          SUNLinSolFree(*(SUNLinearSolver *)(muk + 0x48));
                          free((void *)muk);
                          muk = 0;
                          KINProcessError((KINMem)kinls_mem,-8,"KINBBDPRE","KINBBDPrecInit",
                                          "An error arose from a SUNBandLinearSolver routine.");
                          kinmem_local._4_4_ = -8;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return kinmem_local._4_4_;
}

Assistant:

int KINBBDPrecInit(void *kinmem, sunindextype Nlocal, 
                   sunindextype mudq, sunindextype mldq,
                   sunindextype mukeep, sunindextype mlkeep,
                   realtype dq_rel_uu, 
                   KINBBDLocalFn gloc, KINBBDCommFn gcomm)
{
  KINMem kin_mem;
  KINLsMem kinls_mem;
  KBBDPrecData pdata;
  sunindextype muk, mlk, storage_mu, lrw1, liw1;
  long int lrw, liw;
  int flag;

  if (kinmem == NULL) {
    KINProcessError(NULL, KINLS_MEM_NULL, "KINBBDPRE",
                    "KINBBDPrecInit", MSGBBD_MEM_NULL);
    return(KINLS_MEM_NULL);
  }
  kin_mem = (KINMem) kinmem;

  /* Test if the LS linear solver interface has been created */
  if (kin_mem->kin_lmem == NULL) {
    KINProcessError(kin_mem, KINLS_LMEM_NULL, "KINBBDPRE",
                    "KINBBDPrecInit", MSGBBD_LMEM_NULL);
    return(KINLS_LMEM_NULL);
  }
  kinls_mem = (KINLsMem) kin_mem->kin_lmem;

  /* Test compatibility of NVECTOR package with the BBD preconditioner */
  /* Note: Do NOT need to check for N_VScale since has already been checked for in KINSOL */
  if (kin_mem->kin_vtemp1->ops->nvgetarraypointer == NULL) {
    KINProcessError(kin_mem, KINLS_ILL_INPUT, "KINBBDPRE",
                    "KINBBDPrecInit", MSGBBD_BAD_NVECTOR);
    return(KINLS_ILL_INPUT);
  }

  /* Allocate data memory */
  pdata = NULL;
  pdata = (KBBDPrecData) malloc(sizeof *pdata);
  if (pdata == NULL) {
    KINProcessError(kin_mem, KINLS_MEM_FAIL,
                    "KINBBDPRE", "KINBBDPrecInit", MSGBBD_MEM_FAIL);
    return(KINLS_MEM_FAIL);
  }

  /* Set pointers to gloc and gcomm; load half-bandwidths */
  pdata->kin_mem = kinmem;
  pdata->gloc = gloc;
  pdata->gcomm = gcomm;
  pdata->mudq = SUNMIN(Nlocal-1, SUNMAX(0, mudq));
  pdata->mldq = SUNMIN(Nlocal-1, SUNMAX(0, mldq));
  muk = SUNMIN(Nlocal-1, SUNMAX(0, mukeep));
  mlk = SUNMIN(Nlocal-1, SUNMAX(0, mlkeep));
  pdata->mukeep = muk;
  pdata->mlkeep = mlk;

  /* Set extended upper half-bandwidth for PP (required for pivoting) */
  storage_mu = SUNMIN(Nlocal-1, muk+mlk);

  /* Allocate memory for preconditioner matrix */
  pdata->PP = NULL;
  pdata->PP = SUNBandMatrixStorage(Nlocal, muk, mlk, storage_mu);
  if (pdata->PP == NULL) {
    free(pdata); pdata = NULL;
    KINProcessError(kin_mem, KINLS_MEM_FAIL, "KINBBDPRE",
                    "KINBBDPrecInit", MSGBBD_MEM_FAIL);
    return(KINLS_MEM_FAIL);
  }

  /* Allocate memory for temporary N_Vectors */
  pdata->zlocal = NULL;
  pdata->zlocal = N_VNew_Serial(Nlocal);
  if (pdata->zlocal == NULL) {
    SUNMatDestroy(pdata->PP);
    free(pdata); pdata = NULL;
    KINProcessError(kin_mem, KINLS_MEM_FAIL, "KINBBDPRE", 
                    "KINBBDPrecInit", MSGBBD_MEM_FAIL);
    return(KINLS_MEM_FAIL);
  }

  pdata->rlocal = NULL;
  pdata->rlocal = N_VNewEmpty_Serial(Nlocal); /* empty vector */
  if (pdata->rlocal == NULL) {
    N_VDestroy(pdata->zlocal);
    SUNMatDestroy(pdata->PP);
    free(pdata); pdata = NULL;
    KINProcessError(kin_mem, KINLS_MEM_FAIL, "KINBBDPRE",
                    "KINBBDPrecInit", MSGBBD_MEM_FAIL);
    return(KINLS_MEM_FAIL);
  }

  pdata->tempv1 = NULL;
  pdata->tempv1 = N_VClone(kin_mem->kin_vtemp1);
  if (pdata->tempv1 == NULL) {
    N_VDestroy(pdata->zlocal);
    N_VDestroy(pdata->rlocal);
    SUNMatDestroy(pdata->PP);
    free(pdata); pdata = NULL;
    KINProcessError(kin_mem, KINLS_MEM_FAIL, "KINBBDPRE",
                    "KINBBDPrecInit", MSGBBD_MEM_FAIL);
    return(KINLS_MEM_FAIL);
  }

  pdata->tempv2 = NULL;
  pdata->tempv2 = N_VClone(kin_mem->kin_vtemp1);
  if (pdata->tempv2 == NULL) {
    N_VDestroy(pdata->zlocal);
    N_VDestroy(pdata->rlocal);
    N_VDestroy(pdata->tempv1);
    SUNMatDestroy(pdata->PP);
    free(pdata); pdata = NULL;
    KINProcessError(kin_mem, KINLS_MEM_FAIL, "KINBBDPRE",
                    "KINBBDPrecInit", MSGBBD_MEM_FAIL);
    return(KINLS_MEM_FAIL);
  }

  pdata->tempv3 = NULL;
  pdata->tempv3 = N_VClone(kin_mem->kin_vtemp1);
  if (pdata->tempv3 == NULL) {
    N_VDestroy(pdata->zlocal);
    N_VDestroy(pdata->rlocal);
    N_VDestroy(pdata->tempv1);
    N_VDestroy(pdata->tempv2);
    SUNMatDestroy(pdata->PP);
    free(pdata); pdata = NULL;
    KINProcessError(kin_mem, KINLS_MEM_FAIL, "KINBBDPRE",
                    "KINBBDPrecInit", MSGBBD_MEM_FAIL);
    return(KINLS_MEM_FAIL);
  }

  /* Allocate memory for banded linear solver */
  pdata->LS = NULL;
  pdata->LS = SUNLinSol_Band(pdata->zlocal, pdata->PP);
  if (pdata->LS == NULL) {
    N_VDestroy(pdata->zlocal);
    N_VDestroy(pdata->rlocal);
    N_VDestroy(pdata->tempv1);
    N_VDestroy(pdata->tempv2);
    N_VDestroy(pdata->tempv3);
    SUNMatDestroy(pdata->PP);
    free(pdata); pdata = NULL;
    KINProcessError(kin_mem, KINLS_MEM_FAIL, "KINBBDPRE",
                    "KINBBDPrecInit", MSGBBD_MEM_FAIL);
    return(KINLS_MEM_FAIL);
  }

  /* initialize band linear solver object */
  flag = SUNLinSolInitialize(pdata->LS);
  if (flag != SUNLS_SUCCESS) {
    N_VDestroy(pdata->zlocal);
    N_VDestroy(pdata->rlocal);
    N_VDestroy(pdata->tempv1);
    N_VDestroy(pdata->tempv2);
    N_VDestroy(pdata->tempv3);
    SUNMatDestroy(pdata->PP);
    SUNLinSolFree(pdata->LS);
    free(pdata); pdata = NULL;
    KINProcessError(kin_mem, KINLS_SUNLS_FAIL, "KINBBDPRE",
                    "KINBBDPrecInit", MSGBBD_SUNLS_FAIL);
    return(KINLS_SUNLS_FAIL);
  }

  /* Set rel_uu based on input value dq_rel_uu (0 implies default) */
  pdata->rel_uu = (dq_rel_uu > ZERO) ? dq_rel_uu : SUNRsqrt(kin_mem->kin_uround);

  /* Store Nlocal to be used in KINBBDPrecSetup */
  pdata->n_local = Nlocal;

  /* Set work space sizes and initialize nge */
  pdata->rpwsize = 0;
  pdata->ipwsize = 0;
  if (kin_mem->kin_vtemp1->ops->nvspace) {
    N_VSpace(kin_mem->kin_vtemp1, &lrw1, &liw1);
    pdata->rpwsize += 3*lrw1;
    pdata->ipwsize += 3*liw1;
  }
  if (pdata->zlocal->ops->nvspace) {
    N_VSpace(pdata->zlocal, &lrw1, &liw1);
    pdata->rpwsize += lrw1;
    pdata->ipwsize += liw1;
  }
  if (pdata->rlocal->ops->nvspace) {
    N_VSpace(pdata->rlocal, &lrw1, &liw1);
    pdata->rpwsize += lrw1;
    pdata->ipwsize += liw1;
  }
  if (pdata->PP->ops->space) {
    flag = SUNMatSpace(pdata->PP, &lrw, &liw);
    pdata->rpwsize += lrw;
    pdata->ipwsize += liw;
  }
  if (pdata->LS->ops->space) {
    flag = SUNLinSolSpace(pdata->LS, &lrw, &liw);
    pdata->rpwsize += lrw;
    pdata->ipwsize += liw;
  }
  pdata->nge = 0;

  /* make sure pdata is free from any previous allocations */
  if (kinls_mem->pfree != NULL)
    kinls_mem->pfree(kin_mem);

  /* Point to the new pdata field in the LS memory */
  kinls_mem->pdata = pdata;

  /* Attach the pfree function */
  kinls_mem->pfree = KINBBDPrecFree;

  /* Attach preconditioner solve and setup functions */
  flag = KINSetPreconditioner(kinmem, KINBBDPrecSetup,
                              KINBBDPrecSolve);

  return(flag);
}